

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

void __thiscall
LLVMBC::LLVMContext::TypedDeleter<LLVMBC::CastInst>::run(TypedDeleter<LLVMBC::CastInst> *this)

{
  Instruction::~Instruction(&this->ptr->super_Instruction);
  return;
}

Assistant:

void run() override
		{
			ptr->~T();
		}